

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O0

void __thiscall cmUVJobServerClient::Impl::ReceivedToken(Impl *this)

{
  Impl *this_local;
  
  DecrementNeedTokens(this);
  HoldToken(this);
  return;
}

Assistant:

void cmUVJobServerClient::Impl::ReceivedToken()
{
  this->DecrementNeedTokens();
  this->HoldToken();
}